

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void HistogramSetRemoveHistogram(VP8LHistogramSet *set,int i,int *num_used)

{
  bool bVar1;
  int *num_used_local;
  int i_local;
  VP8LHistogramSet *set_local;
  
  set->histograms[i] = (VP8LHistogram *)0x0;
  *num_used = *num_used + -1;
  if (i == set->size + -1) {
    while( true ) {
      bVar1 = false;
      if (0 < set->size) {
        bVar1 = set->histograms[set->size + -1] == (VP8LHistogram *)0x0;
      }
      if (!bVar1) break;
      set->size = set->size + -1;
    }
  }
  return;
}

Assistant:

static void HistogramSetRemoveHistogram(VP8LHistogramSet* const set, int i,
                                        int* const num_used) {
  assert(set->histograms[i] != NULL);
  set->histograms[i] = NULL;
  --*num_used;
  // If we remove the last valid one, shrink until the next valid one.
  if (i == set->size - 1) {
    while (set->size >= 1 && set->histograms[set->size - 1] == NULL) {
      --set->size;
    }
  }
}